

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwapIJ.c
# Opt level: O3

void swap_ij_case2(word *f,int totalVars,int i,int j)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  ulong local_68 [7];
  
  local_68[0] = 0xaaaaaaaaaaaaaaaa;
  local_68[1] = 0xcccccccccccccccc;
  local_68[2] = 0xf0f0f0f0f0f0f0f0;
  local_68[3] = 0xff00ff00ff00ff00;
  local_68[4] = 0xffff0000ffff0000;
  local_68[5] = 0xffffffff00000000;
  iVar4 = Kit_TruthWordNum_64bit(totalVars);
  bVar5 = (byte)(j + -6);
  iVar6 = 1 << (bVar5 & 0x1f);
  if (iVar6 < iVar4) {
    iVar9 = 2 << (bVar5 & 0x1f);
    lVar7 = (long)iVar6;
    iVar6 = 0;
    lVar8 = lVar7;
    do {
      if (j + -6 != 0x1f) {
        lVar10 = (long)iVar6;
        uVar1 = local_68[i];
        do {
          uVar2 = f[lVar7 + lVar10];
          uVar3 = f[lVar10];
          bVar5 = (byte)(1 << ((byte)i & 0x1f));
          f[lVar7 + lVar10] = ((uVar3 & uVar1) >> (bVar5 & 0x3f)) + (uVar1 & uVar2);
          f[lVar10] = ((uVar2 & ~uVar1) << (bVar5 & 0x3f)) + (uVar3 & ~uVar1);
          lVar10 = lVar10 + 1;
        } while (lVar10 < lVar8);
      }
      lVar8 = lVar8 + iVar9;
      iVar6 = iVar6 + iVar9;
    } while (lVar8 < iVar4);
  }
  return;
}

Assistant:

void swap_ij_case2( word* f,int totalVars, int i, int j)
{
    word mask[] = { ABC_CONST(0xAAAAAAAAAAAAAAAA), ABC_CONST(0xCCCCCCCCCCCCCCCC), ABC_CONST(0xF0F0F0F0F0F0F0F0),
                    ABC_CONST(0xFF00FF00FF00FF00), ABC_CONST(0xFFFF0000FFFF0000), ABC_CONST(0xFFFFFFFF00000000) };
    word temp;
    int x,y,wj;
    int WORDS_IN_TT = Kit_TruthWordNum_64bit(totalVars);
    //  int forShift = ((Word)1)<<i;
    int forShift = (1<<i);
    wj = 1 << (j - 6);
    x = 0;
    y = wj;
    for(y=wj; y<WORDS_IN_TT;y+=2*wj)
        for(x=y-wj; x < y; x++)
        {
            temp = f[x+wj];
            f[x+wj] = ((f[x+wj])&(mask[i])) + (((f[x]) & (mask[i])) >> forShift);
            f[x] = ((f[x])&(~mask[i])) + ((temp&(~mask[i])) << forShift);
        }
}